

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O1

void __thiscall
duckdb::FirstVectorFunction<false,_true>::Update
          (FirstVectorFunction<false,_true> *this,Vector *inputs,AggregateInputData *input_data,
          idx_t param_3,Vector *state_vector,idx_t count)

{
  uint uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 is_null;
  undefined1 *puVar5;
  unsigned_long val;
  Vector *count_00;
  data_ptr_t pdVar6;
  bool bVar7;
  string_t value;
  SelectionVector sel;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat idata;
  Vector sort_key;
  Vector sliced_input;
  sel_t assign_sel [2048];
  SelectionVector local_21c8;
  LogicalType local_21b0;
  UnifiedVectorFormat local_2198;
  UnifiedVectorFormat local_2150;
  Vector local_2108;
  Vector local_20a0;
  sel_t local_2038 [2050];
  
  is_null = (undefined1)count;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_2150);
  Vector::ToUnifiedFormat((Vector *)this,(idx_t)state_vector,&local_2150);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_2198);
  Vector::ToUnifiedFormat((Vector *)param_3,(idx_t)state_vector,&local_2198);
  count_00 = (Vector *)0x0;
  if (state_vector != (Vector *)0x0) {
    val = 0;
    do {
      uVar2 = val;
      if ((local_2150.sel)->sel_vector != (sel_t *)0x0) {
        uVar2 = (unsigned_long)(local_2150.sel)->sel_vector[val];
      }
      if ((local_2150.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_2150.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar2 >> 6]
           >> (uVar2 & 0x3f) & 1) != 0)) {
        uVar2 = val;
        if ((local_2198.sel)->sel_vector != (sel_t *)0x0) {
          uVar2 = (unsigned_long)(local_2198.sel)->sel_vector[val];
        }
        if (*(char *)(*(long *)(local_2198.data + uVar2 * 8) + 0x10) == '\0') {
          uVar1 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
          local_2038[(long)count_00] = uVar1;
          count_00 = (Vector *)&count_00->field_0x1;
        }
      }
      val = val + 1;
    } while (state_vector != (Vector *)val);
  }
  if (count_00 != (Vector *)0x0) {
    LogicalType::LogicalType(&local_21b0,BLOB);
    Vector::Vector(&local_2108,&local_21b0,0x800);
    LogicalType::~LogicalType(&local_21b0);
    if (count_00 == state_vector) {
      CreateSortKeyHelpers::CreateSortKey
                ((Vector *)this,(idx_t)state_vector,(OrderModifiers)0x302,&local_2108);
    }
    else {
      local_21c8.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_21c8.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_21c8.sel_vector = local_2038;
      Vector::Vector(&local_20a0,(Vector *)this,&local_21c8,(idx_t)count_00);
      CreateSortKeyHelpers::CreateSortKey
                (&local_20a0,(idx_t)count_00,(OrderModifiers)0x302,&local_2108);
      if (local_20a0.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20a0.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_20a0.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20a0.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_20a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType(&local_20a0.type);
      if (local_21c8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_21c8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    pdVar6 = local_2108.data + 8;
    puVar5 = (undefined1 *)0x0;
    do {
      uVar3 = (ulong)local_2038[(long)puVar5];
      uVar4 = uVar3;
      if ((local_2198.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(local_2198.sel)->sel_vector[uVar3];
      }
      if ((*(FirstFunctionStringBase<false,true> **)(local_2198.data + uVar4 * 8))[0x10] ==
          (FirstFunctionStringBase<false,true>)0x0) {
        if ((local_2150.sel)->sel_vector != (sel_t *)0x0) {
          uVar3 = (ulong)(local_2150.sel)->sel_vector[uVar3];
        }
        if (local_2150.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar7 = false;
        }
        else {
          bVar7 = (local_2150.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar3 >> 6] >> (uVar3 & 0x3f) & 1) == 0;
        }
        value.value.inlined.inlined[4] = bVar7;
        value.value._0_8_ = *(undefined8 *)pdVar6;
        value.value._9_7_ = 0;
        FirstFunctionStringBase<false,true>::SetValue<duckdb::FirstState<duckdb::string_t>,false>
                  (*(FirstFunctionStringBase<false,true> **)(local_2198.data + uVar4 * 8),
                   (FirstState<duckdb::string_t> *)inputs,*(AggregateInputData **)(pdVar6 + -8),
                   value,(bool)is_null);
      }
      puVar5 = puVar5 + 1;
      pdVar6 = pdVar6 + 0x10;
    } while (&count_00->vector_type + (count_00 == (Vector *)0x0) != puVar5);
    if (local_2108.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2108.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_2108.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2108.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_2108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_2108.type);
  }
  if (local_2198.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2198.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_2198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2150.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2150.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_2150.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2150.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &input_data, idx_t, Vector &state_vector, idx_t count) {
		auto &input = inputs[0];
		UnifiedVectorFormat idata;
		input.ToUnifiedFormat(count, idata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto idx = idata.sel->get_index(i);
			bool is_null = !idata.validity.RowIsValid(idx);
			if (SKIP_NULLS && is_null) {
				continue;
			}
			auto &state = *states[sdata.sel->get_index(i)];
			if (!LAST && state.is_set) {
				continue;
			}
			assign_sel[assign_count++] = NumericCast<sel_t>(i);
		}
		if (assign_count == 0) {
			// fast path - nothing to set
			return;
		}

		Vector sort_key(LogicalType::BLOB);
		OrderModifiers modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		if (assign_count == count) {
			CreateSortKeyHelpers::CreateSortKey(input, count, modifiers, sort_key);
		} else {
			SelectionVector sel(assign_sel);
			Vector sliced_input(input, sel, assign_count);
			CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		}
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto state_idx = sdata.sel->get_index(assign_sel[i]);
			auto &state = *states[state_idx];
			if (!LAST && state.is_set) {
				continue;
			}

			const auto idx = idata.sel->get_index(assign_sel[i]);
			bool is_null = !idata.validity.RowIsValid(idx);
			FirstFunctionStringBase<LAST, SKIP_NULLS>::template SetValue<STATE>(state, input_data, sort_key_data[i],
			                                                                    is_null);
		}
	}